

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

void parse_ip(packet_t *pkt)

{
  uint uVar1;
  int iVar2;
  double in_XMM0_Qa;
  int ihl;
  packet_t *pkt_local;
  
  if (pkt->payload < 0x14) {
    in_XMM0_Qa = _log(in_XMM0_Qa);
  }
  pkt->ip = (ip_t *)(pkt->data + pkt->offset);
  uVar1 = (uint)(*(byte *)pkt->ip & 0xf);
  iVar2 = uVar1 * 4;
  if (pkt->payload < iVar2) {
    _log(in_XMM0_Qa);
  }
  else {
    pkt->offset = pkt->offset + iVar2;
    pkt->payload = pkt->payload + uVar1 * -4;
    pkt->ip_proto = pkt->ip->proto;
    if (pkt->ip_proto == '\x06') {
      parse_tcp(pkt);
    }
    else if (pkt->ip_proto == '\x11') {
      parse_udp(pkt);
    }
  }
  return;
}

Assistant:

static void parse_ip(packet_t *pkt)
{
	if (pkt->payload < IP_HDR_LEN)  {
		log_err("%s %d length is not enough\n", __FUNCTION__, __LINE__);
	}

	pkt->ip = (ip_t *)&pkt->data[pkt->offset];

	int ihl = pkt->ip->ihl * 4;

	if (pkt->payload < ihl) {
		log_err("%s %d length is not enough\n", __FUNCTION__, __LINE__);
		return;
	}

	pkt->offset += ihl;
	pkt->payload -= ihl;
	pkt->ip_proto = pkt->ip->proto;

	switch (pkt->ip_proto) {
		case IPPROTO_TCP :
			parse_tcp(pkt);
			break;

		case IPPROTO_UDP :
			parse_udp(pkt);
			break;

		default :
			break;
	}
}